

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O3

int any2eucjp(uchar *dest,uchar *src,uint dest_max)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *__s1;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  
  sVar5 = strlen((char *)src);
  iVar4 = DetectKanjiCode_whatcode;
  if (sVar5 < 0x2000) {
    if (dest_max < 0x2001) {
      iVar3 = 8;
      if (DetectKanjiCode_whatcode - 9U < 0xfffffffe) {
        DetectKanjiCode_whatcode = 8;
        iVar3 = iVar4;
      }
      uVar7 = 0;
      iVar4 = DetectKanjiCode_whatcode;
      do {
        iVar6 = (int)uVar7;
        lVar9 = (long)iVar6;
        uVar1 = lVar9 + 1;
        bVar8 = src[lVar9];
        if (bVar8 == 0x1b) {
          uVar7 = lVar9 + 2;
          bVar8 = src[uVar1];
          if (bVar8 == 0x24) {
            bVar8 = src[uVar7];
            if (bVar8 == 0x42) {
              iVar10 = 1;
              iVar2 = iVar10;
              goto LAB_00122cda;
            }
            if (bVar8 == 0x40) {
              iVar10 = 2;
              iVar2 = iVar10;
              goto LAB_00122cda;
            }
          }
          else {
            if (bVar8 != 0x28) {
              uVar7 = uVar7 & 0xffffffff;
              if (bVar8 != 0x4b) goto LAB_00122bfa;
              iVar10 = 4;
              iVar2 = iVar10;
              goto LAB_00122cda;
            }
            bVar8 = src[uVar7];
            if (bVar8 == 0x49) {
              iVar10 = 3;
              iVar2 = iVar10;
              goto LAB_00122cda;
            }
          }
          uVar7 = (ulong)(iVar6 + 3);
        }
        else {
          if (bVar8 == 0) {
LAB_00122c0a:
            iVar10 = iVar4;
            if (iVar3 != 8 && iVar4 == 7) {
              iVar10 = iVar3;
              DetectKanjiCode_whatcode = iVar3;
            }
            iVar2 = DetectKanjiCode_whatcode;
            if (iVar10 == 7) {
              __s1 = getenv("LC_ALL");
              if (((__s1 == (char *)0x0) && (__s1 = getenv("LC_CTYPE"), __s1 == (char *)0x0)) &&
                 (__s1 = getenv("LANG"), __s1 == (char *)0x0)) {
LAB_00122cad:
                iVar10 = 5;
                iVar2 = iVar10;
              }
              else {
                iVar4 = strcmp(__s1,"ja_JP.SJIS");
                iVar10 = 6;
                iVar2 = iVar10;
                if ((iVar4 != 0) && (iVar4 = strcmp(__s1,"ja_JP.mscode"), iVar4 != 0)) {
                  iVar4 = strcmp(__s1,"ja_JP.PCK");
                  iVar10 = (iVar4 == 0) + 5;
                  iVar2 = iVar10;
                }
              }
            }
LAB_00122cda:
            DetectKanjiCode_whatcode = iVar2;
            iVar4 = (*(code *)((long)&DAT_001266c0 + (long)(int)(&DAT_001266c0)[iVar10 - 1]))();
            return iVar4;
          }
          iVar10 = 6;
          iVar2 = iVar10;
          if (((byte)(bVar8 + 0x7f) < 0xd) || ((byte)(bVar8 + 0x71) < 0x11)) goto LAB_00122cda;
          if (bVar8 == 0x8e) {
            bVar8 = src[uVar1];
            if ((((byte)(bVar8 + 0x20) < 0x1d) || ((char)bVar8 < -0x5f)) ||
               ((byte)(bVar8 - 0x40) < 0x3f)) goto LAB_00122cda;
            uVar7 = (ulong)(iVar6 + 2);
            if ((byte)(bVar8 + 0x5f) < 0x3f) goto LAB_00122bd1;
          }
          else if ((byte)(bVar8 + 0x5f) < 0x3f) {
            bVar8 = src[uVar1];
            if ((byte)(bVar8 + 0x10) < 0xf) goto LAB_00122cad;
            uVar7 = (ulong)(iVar6 + 2U);
            if (0x3e < (byte)(bVar8 + 0x5f)) {
              if ((bVar8 & 0xf0) != 0xe0) {
                if (0x9f < bVar8) goto LAB_00122bfa;
                goto LAB_00122cda;
              }
              uVar7 = (ulong)(int)(iVar6 + 2U);
              do {
                if (0x80 < bVar8) {
                  iVar4 = 6;
                  if ((0x8d < bVar8) && (bVar8 == 0x8e || 0x9f < bVar8)) {
                    if (bVar8 == 0xff || bVar8 < 0xfd) goto LAB_00122b31;
                    iVar4 = 5;
                  }
                  bVar8 = src[uVar7];
                  uVar7 = uVar7 + 1;
                  DetectKanjiCode_whatcode = iVar4;
                  goto LAB_00122bfa;
                }
LAB_00122b31:
                bVar8 = src[uVar7];
                uVar7 = uVar7 + 1;
              } while (0x3f < bVar8);
            }
LAB_00122bd1:
            DetectKanjiCode_whatcode = 7;
            iVar4 = 7;
          }
          else {
            if ((byte)(bVar8 + 0x10) < 0xf) goto LAB_00122cad;
            if ((bVar8 & 0xf0) == 0xe0) {
              bVar8 = src[uVar1];
              if ((((char)bVar8 < -0x5f) || ((byte)(bVar8 - 0x40) < 0x3f)) ||
                 (iVar10 = 5, iVar2 = iVar10, (byte)(bVar8 + 3) < 2)) goto LAB_00122cda;
              uVar7 = (ulong)(iVar6 + 2);
              if ((byte)(bVar8 + 0x5f) < 0x5c) goto LAB_00122bd1;
            }
            else {
              uVar7 = uVar1 & 0xffffffff;
            }
          }
        }
LAB_00122bfa:
        if ((bVar8 == 0) || (1 < iVar4 - 7U)) goto LAB_00122c0a;
      } while( true );
    }
    gd_error("invalid maximum size of destination\nit should be less than %d.",0x2000);
  }
  else {
    gd_error("input string too large");
  }
  return -1;
}

Assistant:

int
any2eucjp (unsigned char *dest, unsigned char *src, unsigned int dest_max)
{
	static unsigned char tmp_dest[BUFSIZ];
	int ret;

	if (strlen ((const char *) src) >= BUFSIZ) {
		gd_error("input string too large");
		return -1;
	}
	if (dest_max > BUFSIZ) {
		gd_error
		("invalid maximum size of destination\nit should be less than %d.",
		 BUFSIZ);
		return -1;
	}
	ret = do_check_and_conv (tmp_dest, src);
	if (strlen ((const char *) tmp_dest) >= dest_max) {
		gd_error("output buffer overflow");
		ustrcpy (dest, src);
		return -1;
	}
	ustrcpy (dest, tmp_dest);
	return ret;
}